

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O0

void __thiscall Refal2::CScanner::error(CScanner *this,TError error,char c)

{
  ostream *poVar1;
  string local_1e8 [36];
  byte local_1c4;
  allocator local_1c3;
  byte local_1c2;
  allocator local_1c1;
  string local_1c0 [8];
  string wrongText;
  ostringstream local_190 [8];
  ostringstream errorStream;
  char c_local;
  TError error_local;
  CScanner *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  switch(error) {
  case E_InvalidCharacter:
    poVar1 = std::operator<<((ostream *)local_190,"invalid character `");
    poVar1 = std::operator<<(poVar1,c);
    std::operator<<(poVar1,"`");
    break;
  case E_InvalidControlCharacter:
    poVar1 = std::operator<<((ostream *)local_190,"invalid control character with ASCII code ");
    poVar1 = std::operator<<(poVar1,"`");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)c);
    std::operator<<(poVar1,"`");
    break;
  case E_UnexpectedCharacter:
    poVar1 = std::operator<<((ostream *)local_190,"unexpected character `");
    poVar1 = std::operator<<(poVar1,c);
    std::operator<<(poVar1,"`");
    break;
  case E_UnclosedMultilineCommentAtTheEndOfFile:
    std::operator<<((ostream *)local_190,"unclosed multiline comment at the end of file");
    break;
  case E_UnclosedString:
    std::operator<<((ostream *)local_190,"unclosed string");
    break;
  case E_UnclosedLabel:
    std::operator<<((ostream *)local_190,"unclosed label");
    break;
  case E_UnexpectedCharacterInLabel:
    std::operator<<((ostream *)local_190,"unexpected character in label");
    break;
  case E_UnclosedNumber:
    std::operator<<((ostream *)local_190,"unclosed number");
    break;
  case E_UnclosedQualifier:
    std::operator<<((ostream *)local_190,"unclosed qualifier");
    break;
  case E_UnexpectedCharacterInQualifier:
    std::operator<<((ostream *)local_190,"unexpected character in qualifier");
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Scanner.cpp"
                  ,0x8e,"void Refal2::CScanner::error(TError, char)");
  }
  local_1c2 = 0;
  local_1c4 = 0;
  if (c == '\n') {
    std::allocator<char>::allocator();
    local_1c2 = 1;
    std::__cxx11::string::string(local_1c0,"",&local_1c1);
  }
  else {
    std::allocator<char>::allocator();
    local_1c4 = 1;
    std::__cxx11::string::string(local_1c0,1,c,&local_1c3);
  }
  if ((local_1c4 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1c3);
  }
  if ((local_1c2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  }
  CError::SetTokenData((CError *)this,this->line,this->position,(string *)local_1c0);
  std::__cxx11::ostringstream::str();
  CErrorsHelper::RaiseError((CErrorsHelper *)this,ES_Error,local_1e8);
  std::__cxx11::string::~string((string *)local_1e8);
  CError::ResetToken((CError *)this);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void CScanner::error( TError error, char c )
{
	std::ostringstream errorStream;
	switch( error ) {
		case E_InvalidCharacter:
			errorStream << "invalid character `" << c << "`";
			break;
		case E_InvalidControlCharacter:
			errorStream << "invalid control character with ASCII code "
				<< "`" << static_cast<int>( c ) << "`";
			break;
		case E_UnexpectedCharacter:
			errorStream << "unexpected character `" << c << "`";
			break;
		case E_UnclosedMultilineCommentAtTheEndOfFile:
			errorStream << "unclosed multiline comment at the end of file";
			break;
		case E_UnclosedString:
			errorStream << "unclosed string";
			break;
		case E_UnclosedLabel:
			errorStream << "unclosed label";
			break;
		case E_UnexpectedCharacterInLabel:
			errorStream << "unexpected character in label";
			break;
		case E_UnclosedNumber:
			errorStream << "unclosed number";
			break;
		case E_UnclosedQualifier:
			errorStream << "unclosed qualifier";
			break;
		case E_UnexpectedCharacterInQualifier:
			errorStream << "unexpected character in qualifier";
			break;
		default:
			assert( false );
			break;
	}
	const std::string wrongText = ( c == '\n' ? "" : std::string( 1, c ) );
	CError::SetTokenData( line, position, wrongText );
	CErrorsHelper::RaiseError( ES_Error, errorStream.str() );
	CError::ResetToken();
}